

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.hpp
# Opt level: O0

void __thiscall
Diligent::SPIRVShaderResources::
ProcessResources<Diligent::SPIRVShaderResources::DumpResources[abi:cxx11]()const::__0,Diligent::SPIRVShaderResources::DumpResources[abi:cxx11]()const::__1,Diligent::SPIRVShaderResources::DumpResources[abi:cxx11]()const::__2,Diligent::SPIRVShaderResources::DumpResources[abi:cxx11]()const::__3,Diligent::SPIRVShaderResources::DumpResources[abi:cxx11]()const::__4,Diligent::SPIRVShaderResources::DumpResources[abi:cxx11]()const::__5,Diligent::SPIRVShaderResources::DumpResources[abi:cxx11]()const::__6,Diligent::SPIRVShaderResources::DumpResources[abi:cxx11]()const::__7,Diligent::SPIRVShaderResources::DumpResources[abi:cxx11]()const::__8>
          (SPIRVShaderResources *this,anon_class_24_3_b67b46a3 HandleUB,
          anon_class_24_3_b67b46a3 HandleSB,anon_class_24_3_b67b46a3 HandleImg,
          anon_class_24_3_b67b46a3 HandleSmplImg,anon_class_24_3_b67b46a3 HandleAC,
          anon_class_24_3_b67b46a3 HandleSepSmpl,anon_class_24_3_b67b46a3 HandleSepImg,
          anon_class_24_3_b67b46a3 HandleInptAtt,anon_class_24_3_b67b46a3 HandleAccelStruct)

{
  Uint32 UVar1;
  SPIRVShaderResourceAttribs *pSVar2;
  SPIRVShaderResourceAttribs *AccelStruct;
  Uint32 n_8;
  SPIRVShaderResourceAttribs *InptAtt;
  Uint32 n_7;
  SPIRVShaderResourceAttribs *SepImg;
  Uint32 n_6;
  SPIRVShaderResourceAttribs *SepSmpl;
  Uint32 n_5;
  SPIRVShaderResourceAttribs *AC;
  Uint32 n_4;
  SPIRVShaderResourceAttribs *SmplImg;
  Uint32 n_3;
  SPIRVShaderResourceAttribs *Img;
  Uint32 n_2;
  SPIRVShaderResourceAttribs *SB;
  Uint32 n_1;
  SPIRVShaderResourceAttribs *UB;
  Uint32 n;
  SPIRVShaderResources *this_local;
  
  UB._4_4_ = 0;
  while( true ) {
    UVar1 = GetNumUBs(this);
    if (UVar1 <= UB._4_4_) break;
    pSVar2 = GetUB(this,UB._4_4_);
    DumpResources::anon_class_24_3_b67b46a3::operator()(&HandleUB,pSVar2,UB._4_4_);
    UB._4_4_ = UB._4_4_ + 1;
  }
  SB._4_4_ = 0;
  while( true ) {
    UVar1 = GetNumSBs(this);
    if (UVar1 <= SB._4_4_) break;
    pSVar2 = GetSB(this,SB._4_4_);
    DumpResources::anon_class_24_3_b67b46a3::operator()(&HandleSB,pSVar2,SB._4_4_);
    SB._4_4_ = SB._4_4_ + 1;
  }
  Img._4_4_ = 0;
  while( true ) {
    UVar1 = GetNumImgs(this);
    if (UVar1 <= Img._4_4_) break;
    pSVar2 = GetImg(this,Img._4_4_);
    DumpResources::anon_class_24_3_b67b46a3::operator()(&HandleImg,pSVar2,Img._4_4_);
    Img._4_4_ = Img._4_4_ + 1;
  }
  SmplImg._4_4_ = 0;
  while( true ) {
    UVar1 = GetNumSmpldImgs(this);
    if (UVar1 <= SmplImg._4_4_) break;
    pSVar2 = GetSmpldImg(this,SmplImg._4_4_);
    DumpResources::anon_class_24_3_b67b46a3::operator()(&HandleSmplImg,pSVar2,SmplImg._4_4_);
    SmplImg._4_4_ = SmplImg._4_4_ + 1;
  }
  AC._4_4_ = 0;
  while( true ) {
    UVar1 = GetNumACs(this);
    if (UVar1 <= AC._4_4_) break;
    pSVar2 = GetAC(this,AC._4_4_);
    DumpResources::anon_class_24_3_b67b46a3::operator()(&HandleAC,pSVar2,AC._4_4_);
    AC._4_4_ = AC._4_4_ + 1;
  }
  SepSmpl._4_4_ = 0;
  while( true ) {
    UVar1 = GetNumSepSmplrs(this);
    if (UVar1 <= SepSmpl._4_4_) break;
    pSVar2 = GetSepSmplr(this,SepSmpl._4_4_);
    DumpResources::anon_class_24_3_b67b46a3::operator()(&HandleSepSmpl,pSVar2,SepSmpl._4_4_);
    SepSmpl._4_4_ = SepSmpl._4_4_ + 1;
  }
  SepImg._4_4_ = 0;
  while( true ) {
    UVar1 = GetNumSepImgs(this);
    if (UVar1 <= SepImg._4_4_) break;
    pSVar2 = GetSepImg(this,SepImg._4_4_);
    DumpResources::anon_class_24_3_b67b46a3::operator()(&HandleSepImg,pSVar2,SepImg._4_4_);
    SepImg._4_4_ = SepImg._4_4_ + 1;
  }
  InptAtt._4_4_ = 0;
  while( true ) {
    UVar1 = GetNumInptAtts(this);
    if (UVar1 <= InptAtt._4_4_) break;
    pSVar2 = GetInptAtt(this,InptAtt._4_4_);
    DumpResources::anon_class_24_3_b67b46a3::operator()(&HandleInptAtt,pSVar2,InptAtt._4_4_);
    InptAtt._4_4_ = InptAtt._4_4_ + 1;
  }
  AccelStruct._4_4_ = 0;
  while( true ) {
    UVar1 = GetNumAccelStructs(this);
    if (UVar1 <= AccelStruct._4_4_) break;
    pSVar2 = GetAccelStruct(this,AccelStruct._4_4_);
    DumpResources::anon_class_24_3_b67b46a3::operator()(&HandleAccelStruct,pSVar2,AccelStruct._4_4_)
    ;
    AccelStruct._4_4_ = AccelStruct._4_4_ + 1;
  }
  return;
}

Assistant:

void ProcessResources(THandleUB          HandleUB,
                          THandleSB          HandleSB,
                          THandleImg         HandleImg,
                          THandleSmplImg     HandleSmplImg,
                          THandleAC          HandleAC,
                          THandleSepSmpl     HandleSepSmpl,
                          THandleSepImg      HandleSepImg,
                          THandleInptAtt     HandleInptAtt,
                          THandleAccelStruct HandleAccelStruct) const
    {
        for (Uint32 n = 0; n < GetNumUBs(); ++n)
        {
            const auto& UB = GetUB(n);
            HandleUB(UB, n);
        }

        for (Uint32 n = 0; n < GetNumSBs(); ++n)
        {
            const auto& SB = GetSB(n);
            HandleSB(SB, n);
        }

        for (Uint32 n = 0; n < GetNumImgs(); ++n)
        {
            const auto& Img = GetImg(n);
            HandleImg(Img, n);
        }

        for (Uint32 n = 0; n < GetNumSmpldImgs(); ++n)
        {
            const auto& SmplImg = GetSmpldImg(n);
            HandleSmplImg(SmplImg, n);
        }

        for (Uint32 n = 0; n < GetNumACs(); ++n)
        {
            const auto& AC = GetAC(n);
            HandleAC(AC, n);
        }

        for (Uint32 n = 0; n < GetNumSepSmplrs(); ++n)
        {
            const auto& SepSmpl = GetSepSmplr(n);
            HandleSepSmpl(SepSmpl, n);
        }

        for (Uint32 n = 0; n < GetNumSepImgs(); ++n)
        {
            const auto& SepImg = GetSepImg(n);
            HandleSepImg(SepImg, n);
        }

        for (Uint32 n = 0; n < GetNumInptAtts(); ++n)
        {
            const auto& InptAtt = GetInptAtt(n);
            HandleInptAtt(InptAtt, n);
        }

        for (Uint32 n = 0; n < GetNumAccelStructs(); ++n)
        {
            const auto& AccelStruct = GetAccelStruct(n);
            HandleAccelStruct(AccelStruct, n);
        }

        static_assert(Uint32{SPIRVShaderResourceAttribs::ResourceType::NumResourceTypes} == 12, "Please handle the new resource type here, if needed");
    }